

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

int queryIntItem(void *userData,char *queryItemKey,size_t queryItemKeyLen,long queryItemValue)

{
  long lVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  IResultCapture *pIVar5;
  ExpressionResultBuilder *pEVar6;
  undefined8 uVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this;
  mapped_type *pmVar8;
  allocator local_a19;
  key_type local_a18;
  undefined1 local_9f1;
  undefined1 local_9f0 [7];
  bool this_is_here_to_invoke_warnings_2;
  uint local_7c8;
  allocator<char> local_7c1;
  Value internal_catch_action_2;
  allocator<char> local_799;
  string local_798;
  SourceLineInfo local_778;
  allocator<char> local_749;
  string local_748;
  undefined1 local_728 [8];
  AssertionInfo __assertionInfo196;
  undefined1 local_6b0 [7];
  bool this_is_here_to_invoke_warnings_1;
  uint local_488;
  allocator<char> local_481;
  Value internal_catch_action_1;
  allocator<char> local_459;
  string local_458;
  SourceLineInfo local_438;
  allocator<char> local_409;
  string local_408;
  undefined1 local_3e8 [8];
  AssertionInfo __assertionInfo195;
  undefined1 local_370 [7];
  bool this_is_here_to_invoke_warnings;
  uint local_148;
  allocator<char> local_141;
  Value internal_catch_action;
  allocator<char> local_119;
  string local_118;
  SourceLineInfo local_f8;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  AssertionInfo __assertionInfo194;
  long queryItemValue_local;
  size_t queryItemKeyLen_local;
  char *queryItemKey_local;
  void *userData_local;
  
  __assertionInfo194._104_8_ = queryItemValue;
  queryItemValue_local = queryItemKeyLen;
  queryItemKeyLen_local = (size_t)queryItemKey;
  queryItemKey_local = (char *)userData;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"CAPTURE",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_119);
    Catch::SourceLineInfo::SourceLineInfo(&local_f8,&local_118,0xc2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action,"",&local_141);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_98,&local_b8,&local_f8,(string *)&internal_catch_action,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action);
    std::allocator<char>::~allocator(&local_141);
    Catch::SourceLineInfo::~SourceLineInfo(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    pIVar5 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_370,Info);
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_370,(char (*) [17])"queryItemKey := ");
    pEVar6 = Catch::ExpressionResultBuilder::operator<<(pEVar6,(char **)&queryItemKeyLen_local);
    uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_98);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_370);
    local_148 = uVar4;
    if (uVar4 != 0) {
      if ((uVar4 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_148 & 4) != 0) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::shouldContinueOnFailure(1);
      if (!bVar3) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::isTrue(false);
      if (bVar3) {
        __assertionInfo195._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_98);
    bVar3 = Catch::isTrue(false);
  } while (bVar3);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"CAPTURE",&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_459);
    Catch::SourceLineInfo::SourceLineInfo(&local_438,&local_458,0xc3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action_1,"",&local_481);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_3e8,&local_408,&local_438,(string *)&internal_catch_action_1,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action_1);
    std::allocator<char>::~allocator(&local_481);
    Catch::SourceLineInfo::~SourceLineInfo(&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    pIVar5 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_6b0,Info);
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_6b0,(char (*) [20])"queryItemKeyLen := ");
    pEVar6 = Catch::ExpressionResultBuilder::operator<<
                       (pEVar6,(unsigned_long *)&queryItemValue_local);
    uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_3e8);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_6b0);
    local_488 = uVar4;
    if (uVar4 != 0) {
      if ((uVar4 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_488 & 4) != 0) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::shouldContinueOnFailure(1);
      if (!bVar3) {
        uVar7 = __cxa_allocate_exception(1);
        __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
      }
      bVar3 = Catch::isTrue(false);
      if (bVar3) {
        __assertionInfo196._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_3e8);
    bVar3 = Catch::isTrue(false);
    if (!bVar3) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_748,"CAPTURE",&local_749);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_798,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
                   ,&local_799);
        Catch::SourceLineInfo::SourceLineInfo(&local_778,&local_798,0xc4);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&internal_catch_action_2,"",&local_7c1);
        Catch::AssertionInfo::AssertionInfo
                  ((AssertionInfo *)local_728,&local_748,&local_778,
                   (string *)&internal_catch_action_2,ContinueOnFailure);
        std::__cxx11::string::~string((string *)&internal_catch_action_2);
        std::allocator<char>::~allocator(&local_7c1);
        Catch::SourceLineInfo::~SourceLineInfo(&local_778);
        std::__cxx11::string::~string((string *)&local_798);
        std::allocator<char>::~allocator(&local_799);
        std::__cxx11::string::~string((string *)&local_748);
        std::allocator<char>::~allocator(&local_749);
        pIVar5 = Catch::getResultCapture();
        Catch::ExpressionResultBuilder::ExpressionResultBuilder
                  ((ExpressionResultBuilder *)local_9f0,Info);
        pEVar6 = Catch::ExpressionResultBuilder::operator<<
                           ((ExpressionResultBuilder *)local_9f0,(char (*) [19])"queryItemValue := "
                           );
        pEVar6 = Catch::ExpressionResultBuilder::operator<<
                           (pEVar6,(long *)&__assertionInfo194.resultDisposition);
        uVar4 = (*pIVar5->_vptr_IResultCapture[8])(pIVar5,pEVar6,local_728);
        Catch::ExpressionResultBuilder::~ExpressionResultBuilder
                  ((ExpressionResultBuilder *)local_9f0);
        local_7c8 = uVar4;
        if (uVar4 != 0) {
          if ((uVar4 & 2) != 0) {
            BreakIntoDebugger();
          }
          if ((local_7c8 & 4) != 0) {
            uVar7 = __cxa_allocate_exception(1);
            __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
          }
          bVar3 = Catch::shouldContinueOnFailure(1);
          if (!bVar3) {
            uVar7 = __cxa_allocate_exception(1);
            __cxa_throw(uVar7,&Catch::TestFailureException::typeinfo,0);
          }
          bVar3 = Catch::isTrue(false);
          if (bVar3) {
            local_9f1 = 1;
            Catch::isTrue(true);
          }
        }
        Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_728);
        bVar3 = Catch::isTrue(false);
        sVar2 = queryItemKeyLen_local;
        lVar1 = queryItemValue_local;
        uVar7 = __assertionInfo194._104_8_;
        if (!bVar3) {
          this = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)(queryItemKey_local + 0x150);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a18,(char *)sVar2,lVar1,&local_a19);
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   ::operator[](this,&local_a18);
          *pmVar8 = uVar7;
          std::__cxx11::string::~string((string *)&local_a18);
          std::allocator<char>::~allocator((allocator<char> *)&local_a19);
          return 1;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

inline int queryIntItem(void* userData, const char* queryItemKey, size_t queryItemKeyLen, long int queryItemValue)
{
    CAPTURE(queryItemKey);
    CAPTURE(queryItemKeyLen);
    CAPTURE(queryItemValue);
    static_cast<URI*>(userData)->queryIntItems[std::string(queryItemKey,queryItemKeyLen)] = queryItemValue;
    return 1;
}